

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O0

int ptrlen_strcmp(ptrlen pl1,ptrlen pl2)

{
  ulong uVar1;
  ulong uVar2;
  uint local_4c;
  size_t local_48;
  int cmp;
  size_t minlen;
  ptrlen pl2_local;
  ptrlen pl1_local;
  
  uVar1 = pl2.len;
  uVar2 = pl1.len;
  local_48 = uVar1;
  if (uVar2 < uVar1) {
    local_48 = uVar2;
  }
  if ((local_48 == 0) ||
     (pl1_local.len._4_4_ = memcmp(pl1.ptr,pl2.ptr,local_48), pl1_local.len._4_4_ == 0)) {
    if (uVar2 < uVar1) {
      local_4c = 0xffffffff;
    }
    else {
      local_4c = (uint)(uVar1 < uVar2);
    }
    pl1_local.len._4_4_ = local_4c;
  }
  return pl1_local.len._4_4_;
}

Assistant:

int ptrlen_strcmp(ptrlen pl1, ptrlen pl2)
{
    size_t minlen = pl1.len < pl2.len ? pl1.len : pl2.len;
    if (minlen) {  /* tolerate plX.ptr==NULL as long as plX.len==0 */
        int cmp = memcmp(pl1.ptr, pl2.ptr, minlen);
        if (cmp)
            return cmp;
    }
    return pl1.len < pl2.len ? -1 : pl1.len > pl2.len ? +1 : 0;
}